

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLParserTest_parseNameTest_Test::~OpenDDLParserTest_parseNameTest_Test
          (OpenDDLParserTest_parseNameTest_Test *this)

{
  OpenDDLParserTest::~OpenDDLParserTest(&this->super_OpenDDLParserTest);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseNameTest) {
    size_t len1(0);
    char name1[] = "$testname", *end1(findEnd(name1, len1));

    Name *name = nullptr;
    char *in = OpenDDLParser::parseName(name1, end1, &name);
    EXPECT_TRUE(name != nullptr);
    EXPECT_NE(name1, in);
    delete name;
}